

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

sysbvm_tuple_t sysbvm_integer_parseString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t digitValue_2;
  sysbvm_tuple_t digitValue_1;
  sysbvm_tuple_t digitValue;
  char digit;
  sysbvm_tuple_t sStack_48;
  _Bool canParseRadix;
  sysbvm_tuple_t radix;
  sysbvm_tuple_t result;
  ulong uStack_30;
  _Bool isNegative;
  size_t index;
  char *string_local;
  size_t stringSize_local;
  sysbvm_context_t *context_local;
  
  uStack_30 = 0;
  bVar2 = false;
  if (stringSize != 0) {
    if (*string == '-') {
      bVar2 = true;
      uStack_30 = 1;
    }
    else {
      uStack_30 = (ulong)(*string == '+');
    }
  }
  radix = sysbvm_tuple_integer_encodeSmall(0);
  sStack_48 = sysbvm_tuple_integer_encodeSmall(10);
  bVar3 = true;
  for (; uStack_30 < stringSize; uStack_30 = uStack_30 + 1) {
    cVar1 = string[uStack_30];
    if ((cVar1 < '0') || ('9' < cVar1)) {
      if ((bVar3) || ((cVar1 < 'a' || ('z' < cVar1)))) {
        if ((bVar3) || ((cVar1 < 'A' || ('Z' < cVar1)))) {
          if (cVar1 != '_') {
            if ((bVar3) && ((cVar1 == 'r' || (cVar1 == 'r')))) {
              sStack_48 = radix;
              radix = sysbvm_tuple_integer_encodeSmall(0);
              bVar3 = false;
            }
            else {
              sysbvm_error("Invalid integer literal.");
            }
          }
        }
        else {
          sVar5 = sysbvm_tuple_integer_encodeSmall((long)(cVar1 + -0x37));
          _Var4 = sysbvm_integer_greaterEquals(context,sVar5,sStack_48);
          if (_Var4) {
            sysbvm_error("Digit value is beyond the radix.");
          }
          sVar6 = sysbvm_integer_multiply(context,radix,sStack_48);
          radix = sysbvm_integer_add(context,sVar6,sVar5);
        }
      }
      else {
        sVar5 = sysbvm_tuple_integer_encodeSmall((long)(cVar1 + -0x57));
        _Var4 = sysbvm_integer_greaterEquals(context,sVar5,sStack_48);
        if (_Var4) {
          sysbvm_error("Digit value is beyond the radix.");
        }
        sVar6 = sysbvm_integer_multiply(context,radix,sStack_48);
        radix = sysbvm_integer_add(context,sVar6,sVar5);
      }
    }
    else {
      sVar5 = sysbvm_tuple_integer_encodeSmall((long)(cVar1 + -0x30));
      _Var4 = sysbvm_integer_greaterEquals(context,sVar5,sStack_48);
      if (_Var4) {
        sysbvm_error("Digit value is beyond the radix.");
      }
      sVar6 = sysbvm_integer_multiply(context,radix,sStack_48);
      radix = sysbvm_integer_add(context,sVar6,sVar5);
    }
  }
  if (bVar2) {
    context_local = (sysbvm_context_t *)sysbvm_integer_negated(context,radix);
  }
  else {
    context_local = (sysbvm_context_t *)radix;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_parseString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    size_t index = 0;
    bool isNegative = false;

    // Parse the sign.
    if(index < stringSize)
    {
        if(string[index] == '-')
        {
            isNegative = true;
            ++index;
        }
        else if(string[index] == '+')
        {
            ++index;
        }
    }

    sysbvm_tuple_t result = sysbvm_tuple_integer_encodeSmall(0);
    sysbvm_tuple_t radix = sysbvm_tuple_integer_encodeSmall(10);
    bool canParseRadix = true;
    for(; index < stringSize; ++index)
    {
        char digit = string[index];
        if('0' <= digit && digit <= '9')
        {
            sysbvm_tuple_t digitValue = sysbvm_tuple_integer_encodeSmall(digit - '0');
            if(sysbvm_integer_greaterEquals(context, digitValue, radix))
                sysbvm_error("Digit value is beyond the radix.");

            result = sysbvm_integer_multiply(context, result, radix);
            result = sysbvm_integer_add(context, result, digitValue);
        }
        else if(!canParseRadix && 'a' <= digit && digit <= 'z')
        {
            sysbvm_tuple_t digitValue = sysbvm_tuple_integer_encodeSmall(digit - 'a' + 10);
            if(sysbvm_integer_greaterEquals(context, digitValue, radix))
                sysbvm_error("Digit value is beyond the radix.");
            result = sysbvm_integer_multiply(context, result, radix);
            result = sysbvm_integer_add(context, result, digitValue);
        }
        else if(!canParseRadix && 'A' <= digit && digit <= 'Z')
        {
            sysbvm_tuple_t digitValue = sysbvm_tuple_integer_encodeSmall(digit - 'A' + 10);
            if(sysbvm_integer_greaterEquals(context, digitValue, radix))
                sysbvm_error("Digit value is beyond the radix.");
            result = sysbvm_integer_multiply(context, result, radix);
            result = sysbvm_integer_add(context, result, digitValue);
        }
        else if('_' == digit)
        {
            // Ignore it
        }
        else if(canParseRadix && ('r' == digit || 'r' == digit))
        {
            // We just saw the radix.
            radix = result;
            result = sysbvm_tuple_integer_encodeSmall(0);
            canParseRadix = false;
        }
        else
        {
            sysbvm_error("Invalid integer literal.");
        }
    }

    if(isNegative)
        return sysbvm_integer_negated(context, result);

    return result;
}